

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_tests.cpp
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
* evaluation_speed_test_abi_cxx11_
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             *__return_storage_ptr__,ChebyshevExpansion *cee,vectype *xpts,long N)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  long lVar3;
  mapped_type *pmVar4;
  double *pdVar5;
  double *pdVar6;
  undefined8 *puVar7;
  long __tmp;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  double *__tmp_1;
  long lVar12;
  double dVar13;
  double *local_80;
  undefined1 local_78 [32];
  double *local_58;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *local_50;
  double *local_48;
  long local_40;
  long local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50 = __return_storage_ptr__;
  local_48 = (double *)std::chrono::_V2::system_clock::now();
  local_40 = N;
  if (N < 1) {
    uVar10 = 0;
    pdVar6 = (double *)0x0;
  }
  else {
    local_80 = (double *)0x0;
    uVar8 = 0;
    do {
      ChebTools::ChebyshevExpansion::y_recurrence_xscaled((ChebyshevExpansion *)local_78,&cee->m_c);
      uVar10 = local_78._8_8_;
      pdVar6 = (double *)local_78._0_8_;
      local_78._0_8_ = local_80;
      local_78._8_8_ = uVar8;
      free(local_80);
      N = N + -1;
      uVar8 = uVar10;
      local_80 = pdVar6;
    } while (N != 0);
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"recurrence[vector]","");
  local_58 = pdVar6;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[](local_50,(key_type *)local_78);
  lVar12 = local_40;
  lVar3 = lVar3 - (long)local_48;
  local_48 = (double *)(double)local_40;
  *pmVar4 = (((double)lVar3 / 1000000000.0) / (double)local_48) * 1000000.0;
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  local_38 = std::chrono::_V2::system_clock::now();
  pdVar6 = local_58;
  pdVar5 = local_58;
  local_80 = (double *)uVar10;
  if (0 < lVar12) {
    do {
      ChebTools::ChebyshevExpansion::y_Clenshaw_xscaled((ChebyshevExpansion *)local_78,&cee->m_c);
      uVar10 = local_78._8_8_;
      pdVar6 = (double *)local_78._0_8_;
      local_78._8_8_ = local_80;
      local_78._0_8_ = pdVar5;
      free(pdVar5);
      local_80 = (double *)uVar10;
      lVar12 = lVar12 + -1;
      pdVar5 = pdVar6;
    } while (lVar12 != 0);
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Clenshaw[vector]","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[](local_50,(key_type *)local_78);
  lVar12 = local_40;
  *pmVar4 = (((double)(lVar3 - local_38) / 1000000000.0) / (double)local_48) * 1000000.0;
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  pdVar5 = (double *)std::chrono::_V2::system_clock::now();
  uVar8 = (xpts->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (-1 < (long)uVar8) {
    if (uVar10 != uVar8) {
      free(pdVar6);
      if (uVar8 == 0) {
        pdVar6 = (double *)0x0;
      }
      else {
        if (uVar8 >> 0x3d != 0) {
LAB_001291a5:
          puVar7 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar7 = operator_new;
          __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        pdVar6 = (double *)malloc(uVar8 * 8);
        if (uVar8 != 1 && ((ulong)pdVar6 & 0xf) != 0) goto LAB_001294e7;
        if (pdVar6 == (double *)0x0) goto LAB_001291a5;
      }
    }
    local_58 = pdVar5;
    if (0 < lVar12) {
      lVar3 = 0;
      do {
        uVar9 = (uint)(xpts->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_rows;
        if (0 < (int)uVar9) {
          uVar11 = (ulong)(uVar9 & 0x7fffffff);
          uVar10 = uVar11;
          do {
            if ((xpts->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows < (long)uVar10) goto LAB_0012948a;
            dVar13 = ChebTools::ChebyshevExpansion::y_recurrence
                               (cee,(xpts->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                    m_storage.m_data[uVar10 - 1]);
            if ((long)uVar8 < (long)uVar11) goto LAB_001294a9;
            pdVar6[uVar10 - 1] = dVar13;
            bVar2 = 1 < uVar10;
            uVar10 = uVar10 - 1;
          } while (bVar2);
        }
        lVar3 = lVar3 + 1;
        lVar12 = local_40;
      } while (lVar3 != local_40);
    }
    lVar3 = std::chrono::_V2::system_clock::now();
    local_78._0_8_ = local_78 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"recurrence[1x1]","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::operator[](local_50,(key_type *)local_78);
    *pmVar4 = (((double)(lVar3 - (long)local_58) / 1000000000.0) / (double)local_48) * 1000000.0;
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    pdVar5 = (double *)std::chrono::_V2::system_clock::now();
    uVar10 = (xpts->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
    ;
    if (-1 < (long)uVar10) {
      if (uVar8 != uVar10) {
        free(pdVar6);
        if (uVar10 != 0) {
          if (uVar10 >> 0x3d == 0) {
            pdVar6 = (double *)malloc(uVar10 * 8);
            if (uVar10 != 1 && ((ulong)pdVar6 & 0xf) != 0) {
LAB_001294e7:
              __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/util/Memory.h"
                            ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
            }
            if (pdVar6 != (double *)0x0) goto LAB_00129354;
          }
          puVar7 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar7 = operator_new;
          __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        pdVar6 = (double *)0x0;
      }
LAB_00129354:
      local_58 = pdVar5;
      if (0 < lVar12) {
        lVar12 = 0;
        do {
          uVar9 = (uint)(xpts->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_rows;
          if (0 < (int)uVar9) {
            uVar11 = (ulong)(uVar9 & 0x7fffffff);
            uVar8 = uVar11;
            do {
              if ((xpts->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows < (long)uVar8) {
LAB_0012948a:
                __assert_fail("index >= 0 && index < size()",
                              "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                              ,0xb5,
                              "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                             );
              }
              dVar13 = (xpts->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data[uVar8 - 1];
              dVar13 = ChebTools::ChebyshevExpansion::y_Clenshaw_xscaled
                                 (cee,((dVar13 + dVar13) - (cee->m_xmax + cee->m_xmin)) /
                                      (cee->m_xmax - cee->m_xmin));
              if ((long)uVar10 < (long)uVar11) {
LAB_001294a9:
                __assert_fail("index >= 0 && index < size()",
                              "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                              ,0x1ab,
                              "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                             );
              }
              pdVar6[uVar8 - 1] = dVar13;
              bVar2 = 1 < uVar8;
              uVar8 = uVar8 - 1;
            } while (bVar2);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != local_40);
      }
      lVar12 = std::chrono::_V2::system_clock::now();
      local_78._0_8_ = local_78 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Clenshaw[1x1]","");
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::operator[](local_50,(key_type *)local_78);
      *pmVar4 = (((double)(lVar12 - (long)local_58) / 1000000000.0) / (double)local_48) * 1000000.0;
      if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
      free(pdVar6);
      return local_50;
    }
  }
  __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                ,0x130,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

std::map<std::string, double> evaluation_speed_test(ChebyshevExpansion &cee, const vectype &xpts, long N) {
    std::map<std::string, double> output;
    vectype ypts;

    auto startTime = std::chrono::system_clock::now();
    for (int i = 0; i < N; ++i) {
        ypts = cee.y_recurrence_xscaled(xpts);
    }
    auto endTime = std::chrono::system_clock::now();
    auto elap_us = std::chrono::duration<double>(endTime - startTime).count() / N*1e6;
    output["recurrence[vector]"] = elap_us;

    startTime = std::chrono::system_clock::now();
    for (int i = 0; i < N; ++i) {
        ypts = cee.y_Clenshaw_xscaled(xpts);
    }
    endTime = std::chrono::system_clock::now();
    elap_us = std::chrono::duration<double>(endTime - startTime).count() / N*1e6;
    output["Clenshaw[vector]"] = elap_us;

    startTime = std::chrono::system_clock::now();
    ypts.resize(xpts.size());
    for (int i = 0; i < N; ++i) {
        for (int n = static_cast<int>(xpts.size()) - 1; n >= 0; --n) {
            ypts(n) = cee.y_recurrence(xpts(n));
        }
    }
    endTime = std::chrono::system_clock::now();
    elap_us = std::chrono::duration<double>(endTime - startTime).count() / N*1e6;
    output["recurrence[1x1]"] = elap_us;

    startTime = std::chrono::system_clock::now();
    ypts.resize(xpts.size());
    for (int i = 0; i < N; ++i) {
        for (int n = static_cast<int>(xpts.size()) - 1; n >= 0; --n) {
            ypts(n) = cee.y_Clenshaw(xpts(n));
        }
    }
    endTime = std::chrono::system_clock::now();
    elap_us = std::chrono::duration<double>(endTime - startTime).count() / N*1e6;
    output["Clenshaw[1x1]"] = elap_us;
    return output;
}